

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb_reassign(void *new_context,void *ptr)

{
  long lVar1;
  void *pvVar2;
  stb__alloc *psVar3;
  undefined8 *puVar4;
  long *plVar5;
  
  if (new_context == (void *)0x0) {
    psVar3 = &stb__alloc_global;
  }
  else if (((uint)*(long *)((long)new_context + -8) & 3) == 1) {
    psVar3 = (stb__alloc *)(*(long *)((long)new_context + -8) + -1);
  }
  else {
    psVar3 = (stb__alloc *)((long)new_context + -0x20);
  }
  plVar5 = *(long **)((long)ptr + -8);
  if (((ulong)plVar5 & 3) == 0) {
    lVar1 = *(long *)((long)ptr + -0x10);
    *plVar5 = lVar1;
    if (lVar1 != 0) {
      puVar4 = (undefined8 *)(lVar1 + -0x20);
      if ((*(uint *)(lVar1 + -8) & 3) != 2) {
        puVar4 = (undefined8 *)(lVar1 + -8);
      }
      *puVar4 = *(undefined8 *)((long)ptr + -8);
    }
    *(void ***)((long)ptr + -8) = &psVar3->child;
  }
  else {
    if (((uint)plVar5 & 3) != 2) {
      __assert_fail("t == STB__alloc || t == STB__nochildren",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0xb87,"void stb_reassign(void *, void *)");
    }
    lVar1 = *(long *)((long)ptr + -0x10);
    **(long **)((long)ptr + -0x20) = lVar1;
    if (lVar1 != 0) {
      puVar4 = (undefined8 *)(lVar1 + -0x20);
      if ((*(uint *)(lVar1 + -8) & 3) != 2) {
        puVar4 = (undefined8 *)(lVar1 + -8);
      }
      *puVar4 = *(undefined8 *)((long)ptr + -0x20);
    }
    *(void ***)((long)ptr + -0x20) = &psVar3->child;
  }
  pvVar2 = psVar3->child;
  *(void **)((long)ptr + -0x10) = pvVar2;
  psVar3->child = ptr;
  if (pvVar2 != (void *)0x0) {
    plVar5 = (long *)((long)pvVar2 + -0x20);
    if ((*(uint *)((long)pvVar2 + -8) & 3) != 2) {
      plVar5 = (long *)((long)pvVar2 + -8);
    }
    *plVar5 = (long)ptr + -0x10;
  }
  return;
}

Assistant:

void stb_reassign(void *new_context, void *ptr)
{
   stb__alloc *src = stb__get_context(new_context);

   stb__alloc_type t = stb__identify(ptr);
   assert(t == STB__alloc || t == STB__nochildren);

   if (t == STB__alloc) {
      stb__alloc *s = (stb__alloc *) ptr - 1;

      // unlink from old
      *(s->prevn) = s->next;
      if (s->next)
         *stb__prevn(s->next) = s->prevn;

      stb__insert_alloc(src, s);
   } else {
      stb__nochildren *s = (stb__nochildren *) ptr - 1;

      // unlink from old
      *(s->prevn) = s->next;
      if (s->next)
         *stb__prevn(s->next) = s->prevn;

      stb__insert_nochild(src, s);
   }
}